

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O0

void Diligent::LinuxDebug::OutputDebugMessage
               (DEBUG_MESSAGE_SEVERITY Severity,Char *Message,char *Function,char *File,int Line,
               TextColor Color)

{
  char *pcVar1;
  ostream *poVar2;
  int in_stack_ffffffffffffff78;
  char *ColorCode;
  String msg;
  TextColor Color_local;
  int Line_local;
  char *File_local;
  char *Function_local;
  Char *Message_local;
  DEBUG_MESSAGE_SEVERITY Severity_local;
  
  msg.field_2._8_4_ = Color;
  msg.field_2._12_4_ = Line;
  BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
            ((String *)&ColorCode,(BasicPlatformDebug *)(ulong)Severity,
             (DEBUG_MESSAGE_SEVERITY)Message,Function,File,(char *)(ulong)(uint)Line,
             in_stack_ffffffffffffff78);
  pcVar1 = BasicPlatformDebug::TextColorToTextColorCode(Severity,msg.field_2._8_4_);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,(string *)&ColorCode);
  std::operator<<(poVar2,"\x1b[39m");
  std::__cxx11::string::~string((string *)&ColorCode);
  return;
}

Assistant:

void LinuxDebug::OutputDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                    const Char*            Message,
                                    const char*            Function,
                                    const char*            File,
                                    int                    Line,
                                    TextColor              Color)
{
    auto msg = FormatDebugMessage(Severity, Message, Function, File, Line);

    const auto* ColorCode = TextColorToTextColorCode(Severity, Color);
    std::cout << ColorCode << msg << TextColorCode::Default;
}